

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

int __thiscall QString::remove(QString *this,char *__filename)

{
  long lVar1;
  long in_FS_OFFSET;
  QLatin1String *in_stack_00000018;
  QString *in_stack_00000020;
  CaseSensitivity in_stack_000000bc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  removeStringImpl<QLatin1String>(in_stack_00000020,in_stack_00000018,in_stack_000000bc);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)this;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::remove(QLatin1StringView str, Qt::CaseSensitivity cs)
{
    removeStringImpl(*this, str, cs);
    return *this;
}